

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O1

void __thiscall helics::Input::loadSourceInformation(Input *this)

{
  vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  *this_00;
  size_type sVar1;
  char *pcVar2;
  pointer pcVar3;
  element_type *peVar4;
  pointer ppVar5;
  string_view typeName;
  string_view typeName_00;
  string_view typeName_01;
  shared_ptr<units::precise_unit> *psVar6;
  bool bVar7;
  DataType DVar8;
  precise_unit *__tmp;
  string *psVar9;
  string *psVar10;
  reference pbVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  uint64_t uVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  precise_unit *__tmp_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer ppVar15;
  _Base_ptr __new_size;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *this_02;
  long lVar16;
  _func_int **pp_Var17;
  string_view jsonString;
  string_view jsonString_00;
  string_view jsonString_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var18;
  precise_unit pVar19;
  iterator __end3;
  json jvalue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  iterator __begin3;
  char *in_stack_fffffffffffffed8;
  Input *pIVar20;
  Input *pIVar21;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_118;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_f8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_d8;
  iterator local_c8;
  DataType local_a4;
  string *local_a0;
  string local_98;
  void *local_78;
  string local_70;
  string local_50;
  
  if (this->targetType == HELICS_UNKNOWN) {
    Interface::getExtractionType_abi_cxx11_(&this->super_Interface);
    typeName._M_str = in_stack_fffffffffffffed8;
    typeName._M_len = 0x271d72;
    DVar8 = getTypeFromString(typeName);
    this->targetType = DVar8;
  }
  this->multiUnits = false;
  psVar9 = Interface::getInjectionType_abi_cxx11_(&this->super_Interface);
  psVar10 = Interface::getInjectionUnits_abi_cxx11_(&this->super_Interface);
  typeName_00._M_str = in_stack_fffffffffffffed8;
  typeName_00._M_len = 0x271d9d;
  DVar8 = getTypeFromString(typeName_00);
  this->injectionType = DVar8;
  if (DVar8 != HELICS_MULTI) {
    sVar1 = psVar10->_M_string_length;
    if (sVar1 == 0) {
      return;
    }
    if (*(psVar10->_M_dataplus)._M_p != '[') {
      if (sVar1 == 0) {
        return;
      }
      pcVar3 = (psVar10->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar3,pcVar3 + sVar1);
      uVar13 = ::units::getDefaultFlags();
      _Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               ::units::unit_from_string(&local_70,uVar13);
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      p_Var12->_M_use_count = 1;
      p_Var12->_M_weak_count = 1;
      p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00552820;
      p_Var12[1] = _Var18;
      (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)(p_Var12 + 1);
      p_Var14 = (this->inputUnits).
                super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var12;
      pIVar20 = this;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      peVar4 = (this->inputUnits).
               super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (!NAN(peVar4->multiplier_)) {
        return;
      }
      if (peVar4->base_units_ != (unit_data)0xfa94a488) {
        return;
      }
      p_Var14 = (pIVar20->inputUnits).
                super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (pIVar20->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      (pIVar20->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      goto LAB_00272263;
    }
  }
  this_00 = &this->sourceTypes;
  pIVar20 = this;
  local_a0 = psVar10;
  std::
  vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  ::clear(this_00);
  if (this->injectionType == HELICS_MULTI) {
    jsonString._M_str = (char *)psVar9->_M_string_length;
    jsonString._M_len = (size_t)&local_f8;
    fileops::loadJsonStr_abi_cxx11_(jsonString);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin(&local_c8,
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)&local_f8);
    local_118.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_118.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    local_118.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if ((char)local_f8.m_object == '\x02') {
      local_118.m_it.array_iterator._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            *)(local_f8.m_it.object_iterator._M_node)->_M_parent;
    }
    else if ((char)local_f8.m_object == '\x01') {
      local_118.m_it.object_iterator._M_node =
           (_Base_ptr)&(local_f8.m_it.object_iterator._M_node)->_M_parent;
    }
    else {
      local_118.m_it.primitive_iterator.m_it = 1;
    }
    local_118.m_object = (pointer)&local_f8;
    while (bVar7 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             (&local_c8,&local_118), !bVar7) {
      pbVar11 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*(&local_c8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_f8.m_it.array_iterator,pbVar11);
      typeName_01._M_str = (char *)pIVar20;
      typeName_01._M_len = 0x272033;
      local_a4 = getTypeFromString(typeName_01);
      local_78 = (void *)0x0;
      std::
      vector<std::pair<helics::DataType,std::shared_ptr<units::precise_unit>>,std::allocator<std::pair<helics::DataType,std::shared_ptr<units::precise_unit>>>>
      ::emplace_back<helics::DataType,decltype(nullptr)>
                ((vector<std::pair<helics::DataType,std::shared_ptr<units::precise_unit>>,std::allocator<std::pair<helics::DataType,std::shared_ptr<units::precise_unit>>>>
                  *)this_00,&local_a4,&local_78);
      if (local_f8.m_it.array_iterator._M_current != &local_d8) {
        operator_delete(local_f8.m_it.array_iterator._M_current,local_d8.m_data._0_8_ + 1);
      }
      if (*(char *)CONCAT44(local_c8.m_object._4_4_,(DataType)local_c8.m_object) == '\x02') {
        local_c8.m_it.array_iterator._M_current = local_c8.m_it.array_iterator._M_current + 1;
      }
      else if (*(char *)CONCAT44(local_c8.m_object._4_4_,(DataType)local_c8.m_object) == '\x01') {
        local_c8.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_c8.m_it.object_iterator._M_node);
      }
      else {
        local_c8.m_it.primitive_iterator.m_it = local_c8.m_it.primitive_iterator.m_it + 1;
      }
    }
    this_02 = &local_f8;
  }
  else {
    jsonString_00._M_str = (char *)local_a0->_M_string_length;
    jsonString_00._M_len = (size_t)&local_118;
    fileops::loadJsonStr_abi_cxx11_(jsonString_00);
    __new_size = (_Base_ptr)((ulong)local_118.m_object & 0xff);
    if ((char)local_118.m_object != '\0') {
      if ((char)local_118.m_object == '\x01') {
        __new_size = local_118.m_it.object_iterator._M_node[1]._M_parent;
      }
      else if ((char)local_118.m_object == '\x02') {
        __new_size = (_Base_ptr)
                     ((long)(local_118.m_it.object_iterator._M_node)->_M_parent -
                      (long)*(_Base_ptr *)&(local_118.m_it.object_iterator._M_node)->_M_color >> 4);
      }
      else {
        __new_size = (_Base_ptr)0x1;
      }
    }
    local_c8.m_object._0_4_ = this->injectionType;
    local_c8.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_c8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    std::
    vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
    ::resize(this_00,(size_type)__new_size,(value_type *)&local_c8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.m_it.array_iterator._M_current !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_c8.m_it.array_iterator._M_current);
    }
    this_02 = &local_118;
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)this_02);
  pcVar2 = (char *)local_a0->_M_string_length;
  if (pcVar2 == (char *)0x0) {
    return;
  }
  if (*(local_a0->_M_dataplus)._M_p == '[') {
    pIVar20->multiUnits = true;
    jsonString_01._M_str = pcVar2;
    jsonString_01._M_len = (size_t)&local_f8;
    fileops::loadJsonStr_abi_cxx11_(jsonString_01);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin(&local_c8,
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)&local_f8);
    local_118.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_118.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    local_118.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if ((char)local_f8.m_object == '\x02') {
      local_118.m_it.array_iterator._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            *)(local_f8.m_it.object_iterator._M_node)->_M_parent;
    }
    else if ((char)local_f8.m_object == '\x01') {
      local_118.m_it.object_iterator._M_node =
           (_Base_ptr)&(local_f8.m_it.object_iterator._M_node)->_M_parent;
    }
    else {
      local_118.m_it.primitive_iterator.m_it = 1;
    }
    lVar16 = 0x10;
    local_118.m_object = (pointer)&local_f8;
    while (bVar7 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             (&local_c8,&local_118), !bVar7) {
      pbVar11 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*(&local_c8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_f8.m_it.array_iterator,pbVar11);
      if (local_f8.m_it.primitive_iterator.m_it != 0) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_f8.m_it.array_iterator._M_current,
                   &((local_f8.m_it.array_iterator._M_current)->m_data).m_type +
                   local_f8.m_it.primitive_iterator.m_it);
        uVar13 = ::units::getDefaultFlags();
        pVar19 = ::units::unit_from_string(&local_98,uVar13);
        pp_Var17 = (_func_int **)pVar19.multiplier_;
        p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
        p_Var14->_M_use_count = 1;
        p_Var14->_M_weak_count = 1;
        p_Var14->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00552820;
        p_Var14[1]._vptr__Sp_counted_base = pp_Var17;
        p_Var14[1]._M_use_count = (int)pVar19._8_8_;
        p_Var14[1]._M_weak_count = (int)((ulong)pVar19._8_8_ >> 0x20);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((!NAN((double)p_Var14[1]._vptr__Sp_counted_base)) ||
           (p_Var14[1]._M_use_count != -0x56b5b78)) {
          ppVar15 = (this_00->
                    super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)ppVar15 + lVar16 + -8) =
               p_Var14 + 1;
          p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&ppVar15->first + lVar16);
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&ppVar15->first + lVar16) =
               p_Var14;
          if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
          }
          p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
      }
      if (local_f8.m_it.array_iterator._M_current != &local_d8) {
        operator_delete(local_f8.m_it.array_iterator._M_current,local_d8.m_data._0_8_ + 1);
      }
      if (*(char *)CONCAT44(local_c8.m_object._4_4_,(DataType)local_c8.m_object) == '\x02') {
        local_c8.m_it.array_iterator._M_current = local_c8.m_it.array_iterator._M_current + 1;
      }
      else if (*(char *)CONCAT44(local_c8.m_object._4_4_,(DataType)local_c8.m_object) == '\x01') {
        local_c8.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_c8.m_it.object_iterator._M_node);
      }
      else {
        local_c8.m_it.primitive_iterator.m_it = local_c8.m_it.primitive_iterator.m_it + 1;
      }
      lVar16 = lVar16 + 0x18;
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&local_f8);
    return;
  }
  pcVar3 = (local_a0->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar3,pcVar2 + (long)pcVar3);
  uVar13 = ::units::getDefaultFlags();
  pIVar21 = pIVar20;
  _Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)::units::unit_from_string(&local_50,uVar13)
  ;
  p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  p_Var12->_M_use_count = 1;
  p_Var12->_M_weak_count = 1;
  p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00552820;
  p_Var12[1] = _Var18;
  (pIVar20->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var12 + 1);
  p_Var14 = (pIVar20->inputUnits).
            super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pIVar20->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var12;
  if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  peVar4 = (pIVar20->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if ((!NAN(peVar4->multiplier_)) || (peVar4->base_units_ != (unit_data)0xfa94a488)) {
    ppVar15 = (pIVar20->sourceTypes).
              super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (pIVar20->sourceTypes).
             super__Vector_base<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar15 == ppVar5) {
      return;
    }
    psVar6 = &pIVar21->inputUnits;
    this_01 = &(ppVar15->second).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount;
    do {
      ((__shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2> *)(this_01 + -1))->_M_ptr =
           (element_type *)
           (pIVar21->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (this_01,&(psVar6->
                          super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount);
      ppVar15 = (pointer)(this_01 + 1);
      this_01 = this_01 + 3;
    } while (ppVar15 != ppVar5);
    return;
  }
  p_Var14 = (pIVar20->inputUnits).
            super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pIVar20->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pIVar20->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00272263:
  if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
  }
  return;
}

Assistant:

void Input::loadSourceInformation()
{
    if (targetType == DataType::HELICS_UNKNOWN) {
        targetType = getTypeFromString(getExtractionType());
    }
    multiUnits = false;
    const auto& iType = getInjectionType();
    const auto& iUnits = getInjectionUnits();
    injectionType = getTypeFromString(iType);
    if ((injectionType == DataType::HELICS_MULTI) || (!iUnits.empty() && iUnits.front() == '[')) {
        sourceTypes.clear();
        if (injectionType == DataType::HELICS_MULTI) {
            auto jvalue = fileops::loadJsonStr(iType);
            for (auto& res : jvalue) {
                sourceTypes.emplace_back(getTypeFromString(res.get<std::string>()), nullptr);
            }
        } else {
            auto iValue = fileops::loadJsonStr(iUnits);
            sourceTypes.resize(iValue.size(), {injectionType, nullptr});
        }
        if (!iUnits.empty()) {
            if (iUnits.front() == '[') {
                multiUnits = true;
                auto iValue = fileops::loadJsonStr(iUnits);
                int ii{0};
                for (auto& res : iValue) {
                    auto str = res.get<std::string>();
                    if (!str.empty()) {
                        auto U =
                            std::make_shared<units::precise_unit>(units::unit_from_string(str));
                        if (units::is_valid(*U)) {
                            sourceTypes[ii].second = std::move(U);
                        }
                    }
                    ++ii;
                }
            } else {
                inputUnits = std::make_shared<units::precise_unit>(units::unit_from_string(iUnits));
                if (!units::is_valid(*inputUnits)) {
                    inputUnits.reset();
                } else {
                    for (auto& src : sourceTypes) {
                        src.second = inputUnits;
                    }
                }
            }
        }

    } else {
        if (!iUnits.empty()) {
            inputUnits = std::make_shared<units::precise_unit>(units::unit_from_string(iUnits));
            if (!units::is_valid(*inputUnits)) {
                inputUnits.reset();
            }
        }
    }
}